

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall
nonius::standard_reporter::do_benchmark_failure(standard_reporter *this,exception_ptr *eptr)

{
  ostream *poVar1;
  long *plVar2;
  char *pcVar3;
  reporter *in_RDI;
  undefined1 auVar4 [12];
  exception *ex;
  exception_ptr *in_stack_ffffffffffffff98;
  exception_ptr *in_stack_ffffffffffffffa0;
  undefined1 local_18 [24];
  
  poVar1 = reporter::error_stream(in_RDI);
  poVar1 = std::operator<<(poVar1,(string *)
                                  (in_RDI[1].os.super__Function_base._M_functor._M_pod_data + 8));
  std::operator<<(poVar1," failed to run successfully\n");
  if ((in_RDI[1].os.super__Function_base._M_functor._M_pod_data[1] & 1U) == 0) {
    std::__exception_ptr::exception_ptr::exception_ptr
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    auVar4 = std::rethrow_exception((exception_ptr)local_18);
    std::__exception_ptr::exception_ptr::~exception_ptr(in_stack_ffffffffffffffa0);
    if (auVar4._8_4_ == 2) {
      plVar2 = (long *)__cxa_begin_catch(auVar4._0_8_);
      poVar1 = reporter::error_stream(in_RDI);
      poVar1 = std::operator<<(poVar1,"error: ");
      pcVar3 = (char *)(**(code **)(*plVar2 + 0x10))();
      std::operator<<(poVar1,pcVar3);
      __cxa_end_catch();
    }
    else {
      __cxa_begin_catch(auVar4._0_8_);
      poVar1 = reporter::error_stream(in_RDI);
      std::operator<<(poVar1,"unknown error");
      __cxa_end_catch();
    }
  }
  poVar1 = reporter::report_stream((reporter *)0x1ec22f);
  std::operator<<(poVar1,"\nbenchmark aborted\n");
  return;
}

Assistant:

void do_benchmark_failure(std::exception_ptr eptr) override {
            error_stream() << current << " failed to run successfully\n";
            if(!summary) {
                try {
                    std::rethrow_exception(eptr);
                } catch(std::exception& ex) {
                    error_stream() << "error: " << ex.what();
                } catch(...) {
                    error_stream() << "unknown error";
                }
            }
            report_stream() << "\nbenchmark aborted\n";
        }